

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx512_functor::binary_op_rsub>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar11 [64];
  __m128 _outp_5;
  __m128 _b_5;
  __m128 _p_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m256 _p_4;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_3;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m256 _p_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_rsub op;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  int local_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  int local_840;
  undefined8 *local_830;
  uint *local_828;
  undefined1 (*local_820) [64];
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  
  local_830 = in_RDX;
  local_828 = in_RSI;
  local_820 = in_RDI;
  if (in_R8D == 0x10) {
    for (local_840 = 0; local_840 < in_ECX; local_840 = local_840 + 1) {
      auVar11 = vbroadcastss_avx512f(ZEXT416(*local_828));
      auVar11 = vsubps_avx512f(auVar11,*local_820);
      local_900 = auVar11._0_8_;
      uStack_8f8 = auVar11._8_8_;
      uStack_8f0 = auVar11._16_8_;
      uStack_8e8 = auVar11._24_8_;
      uStack_8e0 = auVar11._32_8_;
      uStack_8d8 = auVar11._40_8_;
      uStack_8d0 = auVar11._48_8_;
      uStack_8c8 = auVar11._56_8_;
      *local_830 = local_900;
      local_830[1] = uStack_8f8;
      local_830[2] = uStack_8f0;
      local_830[3] = uStack_8e8;
      local_830[4] = uStack_8e0;
      local_830[5] = uStack_8d8;
      local_830[6] = uStack_8d0;
      local_830[7] = uStack_8c8;
      local_820 = local_820 + 1;
      local_828 = local_828 + 1;
      local_830 = local_830 + 8;
    }
  }
  if (in_R8D == 8) {
    for (local_904 = 0; local_904 + 1 < in_ECX; local_904 = local_904 + 2) {
      uVar1 = *local_828;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_450 = auVar5._0_8_;
      uStack_448 = auVar5._8_8_;
      uVar1 = local_828[1];
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_410 = auVar6._0_8_;
      uStack_408 = auVar6._8_8_;
      auVar7._16_8_ = uStack_410;
      auVar7._0_16_ = auVar5;
      auVar7._24_8_ = uStack_408;
      auVar11 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(uStack_448,CONCAT816(uStack_450,auVar4))),auVar7,1);
      auVar11 = vsubps_avx512f(auVar11,*local_820);
      local_a40 = auVar11._0_8_;
      uStack_a38 = auVar11._8_8_;
      uStack_a30 = auVar11._16_8_;
      uStack_a28 = auVar11._24_8_;
      uStack_a20 = auVar11._32_8_;
      uStack_a18 = auVar11._40_8_;
      uStack_a10 = auVar11._48_8_;
      uStack_a08 = auVar11._56_8_;
      *local_830 = local_a40;
      local_830[1] = uStack_a38;
      local_830[2] = uStack_a30;
      local_830[3] = uStack_a28;
      local_830[4] = uStack_a20;
      local_830[5] = uStack_a18;
      local_830[6] = uStack_a10;
      local_830[7] = uStack_a08;
      local_820 = local_820 + 1;
      local_828 = local_828 + 2;
      local_830 = local_830 + 8;
    }
    for (; local_904 < in_ECX; local_904 = local_904 + 1) {
      uVar1 = *local_828;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_3d0 = auVar4._0_8_;
      uStack_3c8 = auVar4._8_8_;
      auVar10._16_8_ = uStack_3d0;
      auVar10._0_16_ = auVar5;
      auVar10._24_8_ = uStack_3c8;
      auVar7 = vsubps_avx(auVar10,*(undefined1 (*) [32])*local_820);
      local_aa0 = auVar7._0_8_;
      uStack_a98 = auVar7._8_8_;
      uStack_a90 = auVar7._16_8_;
      uStack_a88 = auVar7._24_8_;
      *local_830 = local_aa0;
      local_830[1] = uStack_a98;
      local_830[2] = uStack_a90;
      local_830[3] = uStack_a88;
      local_820 = (undefined1 (*) [64])(*local_820 + 0x20);
      local_828 = local_828 + 1;
      local_830 = local_830 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_aa4 = 0; local_aa4 + 3 < in_ECX; local_aa4 = local_aa4 + 4) {
      uVar1 = *local_828;
      uVar2 = local_828[1];
      uVar3 = local_828[2];
      auVar8._4_4_ = uVar3;
      auVar8._0_4_ = uVar3;
      auVar8._12_4_ = uVar3;
      auVar8._8_4_ = uVar3;
      uVar3 = local_828[3];
      auVar8._20_4_ = uVar3;
      auVar8._16_4_ = uVar3;
      auVar8._28_4_ = uVar3;
      auVar8._24_4_ = uVar3;
      auVar11 = vinsertf64x4_avx512f
                          (ZEXT3264(CONCAT824(CONCAT44(uVar2,uVar2),
                                              CONCAT816(CONCAT44(uVar2,uVar2),
                                                        CONCAT88(CONCAT44(uVar1,uVar1),
                                                                 CONCAT44(uVar1,uVar1))))),auVar8,1)
      ;
      auVar11 = vsubps_avx512f(auVar11,*local_820);
      local_c00 = auVar11._0_8_;
      uStack_bf8 = auVar11._8_8_;
      uStack_bf0 = auVar11._16_8_;
      uStack_be8 = auVar11._24_8_;
      uStack_be0 = auVar11._32_8_;
      uStack_bd8 = auVar11._40_8_;
      uStack_bd0 = auVar11._48_8_;
      uStack_bc8 = auVar11._56_8_;
      *local_830 = local_c00;
      local_830[1] = uStack_bf8;
      local_830[2] = uStack_bf0;
      local_830[3] = uStack_be8;
      local_830[4] = uStack_be0;
      local_830[5] = uStack_bd8;
      local_830[6] = uStack_bd0;
      local_830[7] = uStack_bc8;
      local_820 = local_820 + 1;
      local_828 = local_828 + 4;
      local_830 = local_830 + 8;
    }
    for (; local_aa4 + 1 < in_ECX; local_aa4 = local_aa4 + 2) {
      uVar1 = *local_828;
      auVar9._4_4_ = uVar1;
      auVar9._0_4_ = uVar1;
      auVar9._12_4_ = uVar1;
      auVar9._8_4_ = uVar1;
      uVar1 = local_828[1];
      auVar9._20_4_ = uVar1;
      auVar9._16_4_ = uVar1;
      auVar9._28_4_ = uVar1;
      auVar9._24_4_ = uVar1;
      auVar7 = vsubps_avx(auVar9,*(undefined1 (*) [32])*local_820);
      local_c80 = auVar7._0_8_;
      uStack_c78 = auVar7._8_8_;
      uStack_c70 = auVar7._16_8_;
      uStack_c68 = auVar7._24_8_;
      *local_830 = local_c80;
      local_830[1] = uStack_c78;
      local_830[2] = uStack_c70;
      local_830[3] = uStack_c68;
      local_820 = (undefined1 (*) [64])(*local_820 + 0x20);
      local_828 = local_828 + 2;
      local_830 = local_830 + 4;
    }
    for (; local_aa4 < in_ECX; local_aa4 = local_aa4 + 1) {
      uVar1 = *local_828;
      auVar4._4_4_ = uVar1;
      auVar4._0_4_ = uVar1;
      auVar4._12_4_ = uVar1;
      auVar4._8_4_ = uVar1;
      auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])*local_820);
      local_cb0 = auVar4._0_8_;
      uStack_ca8 = auVar4._8_8_;
      *local_830 = local_cb0;
      local_830[1] = uStack_ca8;
      local_820 = (undefined1 (*) [64])(*local_820 + 0x10);
      local_828 = local_828 + 1;
      local_830 = local_830 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}